

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int parse_object(frozen *f)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  char *pcVar7;
  char *ptr;
  byte *ptr_00;
  byte *pbVar8;
  
  iVar3 = test_and_skip(f,0x7b);
  if ((iVar3 < 0) || (iVar3 = capture_ptr(f,f->cur + -1,JSON_TYPE_OBJECT), iVar3 < 0)) {
    return iVar3;
  }
  iVar3 = f->num_tokens;
  pbVar6 = (byte *)f->end;
  ptr_00 = (byte *)f->cur;
  do {
    if (ptr_00 < pbVar6) {
      do {
        if ((0x20 < (ulong)*ptr_00) || ((0x100002600U >> ((ulong)*ptr_00 & 0x3f) & 1) == 0)) break;
        ptr_00 = ptr_00 + 1;
        f->cur = (char *)ptr_00;
      } while (ptr_00 != pbVar6);
    }
    if (ptr_00 < pbVar6) {
      bVar2 = *ptr_00;
      if (bVar2 == 0x7d) {
        iVar4 = test_and_skip(f,0x7d);
        if (iVar4 < 0) {
          return iVar4;
        }
        capture_len(f,iVar3 + -1,f->cur);
        return 0;
      }
      while (((pbVar8 = ptr_00 + 1, bVar2 < 0x21 &&
              ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) &&
             (f->cur = (char *)pbVar8, ptr_00 = pbVar8, pbVar8 != pbVar6))) {
        bVar2 = *pbVar8;
      }
    }
    if (pbVar6 <= ptr_00) {
      return -2;
    }
    bVar2 = *ptr_00;
    if ((bVar2 & 0xffffffdf) - 0x5b < 0xffffffe6) {
      if (bVar2 != 0x22) {
        return -1;
      }
      iVar4 = parse_string(f);
      if (iVar4 < 0) {
        return iVar4;
      }
    }
    else {
      while( true ) {
        pbVar8 = ptr_00 + 1;
        if (((0x20 < bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) ||
           (f->cur = (char *)pbVar8, ptr_00 = pbVar8, pbVar8 == pbVar6)) break;
        bVar2 = *pbVar8;
      }
      if (pbVar6 <= ptr_00) {
        return -1;
      }
      if ((*ptr_00 & 0xffffffdf) - 0x5b < 0xffffffe6) {
        return -1;
      }
      iVar4 = capture_ptr(f,(char *)ptr_00,JSON_TYPE_STRING);
      if (iVar4 < 0) {
        return iVar4;
      }
      pcVar1 = f->end;
      pcVar7 = f->cur;
      ptr = pcVar7;
      if (pcVar7 < pcVar1) {
        do {
          uVar5 = (uint)*pcVar7;
          if ((uVar5 != 0x5f) &&
             (ptr = pcVar7, (uVar5 & 0xffffffdf) - 0x5b < 0xffffffe6 && uVar5 - 0x3a < 0xfffffff6))
          break;
          pcVar7 = pcVar7 + 1;
          f->cur = pcVar7;
          ptr = pcVar1;
        } while (pcVar7 != pcVar1);
      }
      capture_len(f,f->num_tokens + -1,ptr);
    }
    iVar4 = test_and_skip(f,0x3a);
    if (iVar4 < 0) {
      return iVar4;
    }
    iVar4 = parse_value(f);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar6 = (byte *)f->end;
    ptr_00 = (byte *)f->cur;
    if (ptr_00 < pbVar6) {
      do {
        if ((0x20 < (ulong)*ptr_00) || ((0x100002600U >> ((ulong)*ptr_00 & 0x3f) & 1) == 0)) break;
        ptr_00 = ptr_00 + 1;
        f->cur = (char *)ptr_00;
      } while (ptr_00 != pbVar6);
    }
    if ((ptr_00 < pbVar6) && (*ptr_00 == 0x2c)) {
      ptr_00 = ptr_00 + 1;
      f->cur = (char *)ptr_00;
    }
  } while( true );
}

Assistant:

static int parse_object(struct frozen *f) {
    int ind;
    TRY(test_and_skip(f, '{'));
    TRY(capture_ptr(f, f->cur - 1, JSON_TYPE_OBJECT));
    ind = f->num_tokens - 1;
    while (cur(f) != '}') {
        TRY(parse_pair(f));
        if (cur(f) == ',') f->cur++;
    }
    TRY(test_and_skip(f, '}'));
    capture_len(f, ind, f->cur);
    return 0;
}